

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isAlterableTable(Parse *pParse,Table *pTab)

{
  long lVar1;
  uchar uVar2;
  ulong uVar3;
  uchar uVar4;
  
  if (pTab->zName == (char *)0x0) {
LAB_001aa419:
    if ((pTab->tabFlags & 0x400) == 0) {
      return 0;
    }
    if ((pParse->db->flags & 0x10000000) == 0) {
      return 0;
    }
    if (pParse->db->nVdbeExec != 0) {
      return 0;
    }
  }
  else {
    lVar1 = 0;
    do {
      uVar3 = (ulong)(byte)pTab->zName[lVar1];
      if (uVar3 == 0) {
        uVar4 = ""[(byte)"sqlite_"[lVar1]];
        uVar2 = '\0';
LAB_001aa410:
        if (uVar2 != uVar4) goto LAB_001aa419;
        break;
      }
      uVar2 = ""[uVar3];
      uVar4 = ""[(byte)"sqlite_"[lVar1]];
      if (uVar2 != uVar4) goto LAB_001aa410;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
  }
  sqlite3ErrorMsg(pParse,"table %s may not be altered");
  return 1;
}

Assistant:

static int isAlterableTable(Parse *pParse, Table *pTab){
  if( 0==sqlite3StrNICmp(pTab->zName, "sqlite_", 7) 
#ifndef SQLITE_OMIT_VIRTUALTABLE
   || ( (pTab->tabFlags & TF_Shadow) 
     && (pParse->db->flags & SQLITE_Defensive)
     && pParse->db->nVdbeExec==0
   )
#endif
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be altered", pTab->zName);
    return 1;
  }
  return 0;
}